

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::operator<<(ostream *s,String *in)

{
  char *pcVar1;
  ostream *poVar2;
  String *in_local;
  ostream *s_local;
  
  pcVar1 = String::c_str(in);
  poVar2 = std::operator<<(s,pcVar1);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& s, const String& in) { return s << in.c_str(); }